

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

int32_t ustrcase_map_63(int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                       int32_t destCapacity,UChar *src,int32_t srcLength,
                       UStringCaseMapper *stringCaseMapper,Edits *edits,UErrorCode *errorCode)

{
  int32_t iVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < destCapacity) {
      if ((src != (UChar *)0x0 && (destCapacity == 0 || dest != (UChar *)0x0)) && -2 < srcLength) {
        if (srcLength == -1) {
          srcLength = u_strlen_63(src);
        }
        if ((dest == (UChar *)0x0) ||
           ((src < dest || dest + (uint)destCapacity <= src &&
            (src + srcLength <= dest || dest < src)))) {
          if ((options >> 0xd & 1) == 0 && edits != (Edits *)0x0) {
            icu_63::Edits::reset(edits);
          }
          iVar1 = (*stringCaseMapper)(caseLocale,options,iter,dest,destCapacity,src,srcLength,edits,
                                      errorCode);
          iVar1 = u_terminateUChars_63(dest,destCapacity,iVar1,errorCode);
          return iVar1;
        }
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

U_CFUNC int32_t
ustrcase_map(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
             UChar *dest, int32_t destCapacity,
             const UChar *src, int32_t srcLength,
             UStringCaseMapper *stringCaseMapper,
             icu::Edits *edits,
             UErrorCode &errorCode) {
    int32_t destLength;

    /* check argument values */
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if( destCapacity<0 ||
        (dest==NULL && destCapacity>0) ||
        src==NULL ||
        srcLength<-1
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the string length */
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }

    /* check for overlapping source and destination */
    if( dest!=NULL &&
        ((src>=dest && src<(dest+destCapacity)) ||
         (dest>=src && dest<(src+srcLength)))
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if (edits != nullptr && (options & U_EDITS_NO_RESET) == 0) {
        edits->reset();
    }
    destLength=stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                dest, destCapacity, src, srcLength, edits, errorCode);
    return u_terminateUChars(dest, destCapacity, destLength, &errorCode);
}